

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ali_roa_request.cpp
# Opt level: O1

void __thiscall
AliRoaRequest::AliRoaRequest
          (AliRoaRequest *this,string *version,string *appid,string *secret,string *url)

{
  pointer pcVar1;
  string local_50;
  
  pcVar1 = (url->_M_dataplus)._M_p;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,pcVar1,pcVar1 + url->_M_string_length);
  AliHttpRequest::AliHttpRequest(&this->super_AliHttpRequest,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  (this->super_AliHttpRequest)._vptr_AliHttpRequest = (_func_int **)&PTR_CommitRequest_00199aa0;
  (this->utc_time_)._M_dataplus._M_p = (pointer)&(this->utc_time_).field_2;
  (this->utc_time_)._M_string_length = 0;
  (this->utc_time_).field_2._M_local_buf[0] = '\0';
  (this->sign_nounce)._M_dataplus._M_p = (pointer)&(this->sign_nounce).field_2;
  (this->sign_nounce)._M_string_length = 0;
  (this->sign_nounce).field_2._M_local_buf[0] = '\0';
  (this->version_)._M_dataplus._M_p = (pointer)&(this->version_).field_2;
  pcVar1 = (version->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->version_,pcVar1,pcVar1 + version->_M_string_length);
  (this->appid_)._M_dataplus._M_p = (pointer)&(this->appid_).field_2;
  pcVar1 = (appid->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->appid_,pcVar1,pcVar1 + appid->_M_string_length);
  (this->secret_)._M_dataplus._M_p = (pointer)&(this->secret_).field_2;
  pcVar1 = (secret->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->secret_,pcVar1,pcVar1 + secret->_M_string_length);
  (this->url_)._M_dataplus._M_p = (pointer)&(this->url_).field_2;
  pcVar1 = (url->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->url_,pcVar1,pcVar1 + url->_M_string_length);
  return;
}

Assistant:

AliRoaRequest::AliRoaRequest(std::string version, 
                                   std::string appid,
                                   std::string secret,
                                   std::string url)
                                   : AliHttpRequest(url),
                                   version_(version),
                                   appid_(appid),
                                   secret_(secret),
                                   url_(url) {

}